

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  longlong lVar13;
  ulong uVar14;
  ulong uVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  byte bVar71;
  char cVar72;
  int iVar73;
  int iVar74;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int8_t *ptr_06;
  uint uVar75;
  int iVar76;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  byte bVar77;
  char cVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  byte bVar91;
  char cVar92;
  byte bVar93;
  char cVar94;
  byte bVar95;
  char cVar96;
  byte bVar97;
  char cVar98;
  byte bVar99;
  char cVar100;
  byte bVar101;
  char cVar102;
  char cVar104;
  byte bVar105;
  byte bVar106;
  char cVar107;
  byte bVar110;
  byte bVar111;
  char cVar112;
  byte bVar113;
  byte bVar114;
  char cVar115;
  byte bVar116;
  byte bVar117;
  char cVar118;
  byte bVar119;
  byte bVar120;
  char cVar121;
  byte bVar122;
  byte bVar123;
  char cVar124;
  byte bVar125;
  byte bVar126;
  char cVar127;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  byte bVar103;
  byte bVar128;
  ulong uVar108;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar109;
  byte bVar129;
  char cVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  __m128i alVar133;
  __m128i alVar134;
  __m128i alVar135;
  __m128i alVar136;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  ulong uStack_1488;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t h;
  int local_11c0;
  int local_11bc;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_110c;
  char local_110b;
  char local_110a;
  char local_1109;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  __m128i vOne;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_1008;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_a18;
  char cStack_a17;
  char cStack_a16;
  char cStack_a15;
  char cStack_a14;
  char cStack_a13;
  char cStack_a12;
  char cStack_a11;
  char cStack_a10;
  char cStack_a0f;
  char cStack_a0e;
  char cStack_a0d;
  char cStack_a0c;
  char cStack_a0b;
  char cStack_a0a;
  char cStack_a09;
  char cStack_9e7;
  char cStack_9e6;
  char cStack_9e5;
  char cStack_9e4;
  char cStack_9e3;
  char cStack_9e2;
  char cStack_9e1;
  char cStack_9e0;
  char cStack_9df;
  char cStack_9de;
  char cStack_9dd;
  char cStack_9dc;
  char cStack_9db;
  char cStack_9da;
  char cStack_9d9;
  char local_9d8;
  char cStack_9d7;
  char cStack_9d6;
  char cStack_9d5;
  char cStack_9d4;
  char cStack_9d3;
  char cStack_9d2;
  char cStack_9d1;
  char cStack_9d0;
  char cStack_9cf;
  char cStack_9ce;
  char cStack_9cd;
  char cStack_9cc;
  char cStack_9cb;
  char cStack_9ca;
  char cStack_9c9;
  char local_9c8;
  char cStack_9c7;
  char cStack_9c6;
  char cStack_9c5;
  char cStack_9c4;
  char cStack_9c3;
  char cStack_9c2;
  char cStack_9c1;
  char cStack_9c0;
  char cStack_9bf;
  char cStack_9be;
  char cStack_9bd;
  char cStack_9bc;
  char cStack_9bb;
  char cStack_9ba;
  char cStack_9b9;
  char local_9b8;
  char cStack_9b7;
  char cStack_9b6;
  char cStack_9b5;
  char cStack_9b4;
  char cStack_9b3;
  char cStack_9b2;
  char cStack_9b1;
  char cStack_9b0;
  char cStack_9af;
  char cStack_9ae;
  char cStack_9ad;
  char cStack_9ac;
  char cStack_9ab;
  char cStack_9aa;
  char cStack_9a9;
  char local_998;
  char cStack_997;
  char cStack_996;
  char cStack_995;
  char cStack_994;
  char cStack_993;
  char cStack_992;
  char cStack_991;
  char cStack_990;
  char cStack_98f;
  char cStack_98e;
  char cStack_98d;
  char cStack_98c;
  char cStack_98b;
  char cStack_98a;
  char cStack_989;
  char local_988;
  char cStack_987;
  char cStack_986;
  char cStack_985;
  char cStack_984;
  char cStack_983;
  char cStack_982;
  char cStack_981;
  char cStack_980;
  char cStack_97f;
  char cStack_97e;
  char cStack_97d;
  char cStack_97c;
  char cStack_97b;
  char cStack_97a;
  char cStack_979;
  char local_968;
  char cStack_967;
  char cStack_966;
  char cStack_965;
  char cStack_964;
  char cStack_963;
  char cStack_962;
  char cStack_961;
  char cStack_960;
  char cStack_95f;
  char cStack_95e;
  char cStack_95d;
  char cStack_95c;
  char cStack_95b;
  char cStack_95a;
  char cStack_959;
  char local_948;
  char cStack_947;
  char cStack_946;
  char cStack_945;
  char cStack_944;
  char cStack_943;
  char cStack_942;
  char cStack_941;
  char cStack_940;
  char cStack_93f;
  char cStack_93e;
  char cStack_93d;
  char cStack_93c;
  char cStack_93b;
  char cStack_93a;
  char cStack_939;
  char local_938;
  char cStack_937;
  char cStack_936;
  char cStack_935;
  char cStack_934;
  char cStack_933;
  char cStack_932;
  char cStack_931;
  char cStack_930;
  char cStack_92f;
  char cStack_92e;
  char cStack_92d;
  char cStack_92c;
  char cStack_92b;
  char cStack_92a;
  char cStack_929;
  char local_928;
  char cStack_927;
  char cStack_926;
  char cStack_925;
  char cStack_924;
  char cStack_923;
  char cStack_922;
  char cStack_921;
  char cStack_920;
  char cStack_91f;
  char cStack_91e;
  char cStack_91d;
  char cStack_91c;
  char cStack_91b;
  char cStack_91a;
  char cStack_919;
  char local_908;
  char cStack_907;
  char cStack_906;
  char cStack_905;
  char cStack_904;
  char cStack_903;
  char cStack_902;
  char cStack_901;
  char cStack_900;
  char cStack_8ff;
  char cStack_8fe;
  char cStack_8fd;
  char cStack_8fc;
  char cStack_8fb;
  char cStack_8fa;
  char cStack_8f9;
  char local_8e8;
  char cStack_8e7;
  char cStack_8e6;
  char cStack_8e5;
  char cStack_8e4;
  char cStack_8e3;
  char cStack_8e2;
  char cStack_8e1;
  char cStack_8e0;
  char cStack_8df;
  char cStack_8de;
  char cStack_8dd;
  char cStack_8dc;
  char cStack_8db;
  char cStack_8da;
  char cStack_8d9;
  char local_8b8;
  char cStack_8b7;
  char cStack_8b6;
  char cStack_8b5;
  char cStack_8b4;
  char cStack_8b3;
  char cStack_8b2;
  char cStack_8b1;
  char cStack_8b0;
  char cStack_8af;
  char cStack_8ae;
  char cStack_8ad;
  char cStack_8ac;
  char cStack_8ab;
  char cStack_8aa;
  char cStack_8a9;
  char local_888;
  char cStack_887;
  char cStack_886;
  char cStack_885;
  char cStack_884;
  char cStack_883;
  char cStack_882;
  char cStack_881;
  char cStack_880;
  char cStack_87f;
  char cStack_87e;
  char cStack_87d;
  char cStack_87c;
  char cStack_87b;
  char cStack_87a;
  char cStack_879;
  byte local_878;
  byte bStack_877;
  byte bStack_876;
  byte bStack_875;
  byte bStack_874;
  byte bStack_873;
  byte bStack_872;
  byte bStack_871;
  byte bStack_870;
  byte bStack_86f;
  byte bStack_86e;
  byte bStack_86d;
  byte bStack_86c;
  byte bStack_86b;
  byte bStack_86a;
  byte bStack_869;
  char local_868;
  char cStack_867;
  char cStack_866;
  char cStack_865;
  char cStack_864;
  char cStack_863;
  char cStack_862;
  char cStack_861;
  char cStack_860;
  char cStack_85f;
  char cStack_85e;
  char cStack_85d;
  char cStack_85c;
  char cStack_85b;
  char cStack_85a;
  char cStack_859;
  char local_858;
  char cStack_857;
  char cStack_856;
  char cStack_855;
  char cStack_854;
  char cStack_853;
  char cStack_852;
  char cStack_851;
  char cStack_850;
  char cStack_84f;
  char cStack_84e;
  char cStack_84d;
  char cStack_84c;
  char cStack_84b;
  char cStack_84a;
  char cStack_849;
  char local_7b8;
  char cStack_7b7;
  char cStack_7b6;
  char cStack_7b5;
  char cStack_7b4;
  char cStack_7b3;
  char cStack_7b2;
  char cStack_7b1;
  char cStack_7b0;
  char cStack_7af;
  char cStack_7ae;
  char cStack_7ad;
  char cStack_7ac;
  char cStack_7ab;
  char cStack_7aa;
  char cStack_7a9;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  undefined1 local_d8 [8];
  undefined1 local_d0 [24];
  undefined1 local_b8 [8];
  undefined1 local_b0 [56];
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  undefined1 local_30 [24];
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_sse41_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_sse41_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_sse41_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_1008 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar4 = profile->matrix;
    iVar73 = (iVar1 + 0xf) / 0x10;
    iVar76 = (iVar1 + -1) % iVar73;
    pvVar5 = (profile->profile8).score;
    pvVar6 = (profile->profile8).matches;
    pvVar7 = (profile->profile8).similar;
    i._0_1_ = (char)open;
    local_d0._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    local_d8._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    uVar8 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_d8._0_3_)))));
    uVar11 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_d0._0_3_)))));
    j._0_1_ = (char)gap;
    local_b0._0_3_ = CONCAT21(CONCAT11((char)j,(char)j),(char)j);
    local_b8._0_3_ = CONCAT21(CONCAT11((char)j,(char)j),(char)j);
    uVar9 = CONCAT17((char)j,CONCAT16((char)j,CONCAT15((char)j,CONCAT14((char)j,CONCAT13((char)j,
                                                  local_b8._0_3_)))));
    uVar12 = CONCAT17((char)j,CONCAT16((char)j,CONCAT15((char)j,CONCAT14((char)j,CONCAT13((char)j,
                                                  local_b0._0_3_)))));
    if (ppVar4->min <= -open) {
      i._0_1_ = -(char)ppVar4->min;
    }
    bVar71 = (char)i + 0x81;
    cVar72 = ((byte)ppVar4->max ^ 0x7f) - 1;
    local_70._0_3_ = CONCAT21(CONCAT11(bVar71,bVar71),bVar71);
    local_78._0_3_ = CONCAT21(CONCAT11(bVar71,bVar71),bVar71);
    lVar10 = CONCAT17(bVar71,CONCAT16(bVar71,CONCAT15(bVar71,CONCAT14(bVar71,CONCAT13(bVar71,
                                                  local_78._0_3_)))));
    lVar13 = CONCAT17(bVar71,CONCAT16(bVar71,CONCAT15(bVar71,CONCAT14(bVar71,CONCAT13(bVar71,
                                                  local_70._0_3_)))));
    local_50._0_3_ = CONCAT21(CONCAT11(cVar72,cVar72),cVar72);
    local_58._0_3_ = CONCAT21(CONCAT11(cVar72,cVar72),cVar72);
    vSaturationCheckMax[1] =
         CONCAT17(cVar72,CONCAT16(cVar72,CONCAT15(cVar72,CONCAT14(cVar72,CONCAT13(cVar72,local_58.
                                                  _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar72,CONCAT16(cVar72,CONCAT15(cVar72,CONCAT14(cVar72,CONCAT13(cVar72,local_50.
                                                  _0_3_)))));
    position._0_1_ = (char)iVar73;
    local_30[2] = (char)position;
    local_30[1] = (char)position;
    local_30[0] = (char)position;
    local_38[2] = (char)position;
    local_38[1] = (char)position;
    local_38[0] = (char)position;
    auVar70[3] = (char)position;
    auVar70._0_3_ = local_38._0_3_;
    auVar70[4] = (char)position;
    auVar70[5] = (char)position;
    auVar70[6] = (char)position;
    auVar70[0xb] = (char)position;
    auVar70._8_3_ = local_30._0_3_;
    auVar70[0xc] = (char)position;
    auVar70[0xd] = (char)position;
    auVar70[0xe] = (char)position;
    auVar70[7] = (char)position;
    local_10[2] = -(char)position * (char)j;
    local_10[1] = local_10[2];
    local_10[0] = local_10[2];
    local_18[2] = local_10[2];
    local_18[1] = local_10[2];
    local_18[0] = local_10[2];
    auVar86[3] = local_10[2];
    auVar86._0_3_ = local_18._0_3_;
    auVar86[4] = local_10[2];
    auVar86[5] = local_10[2];
    auVar86[6] = local_10[2];
    auVar86[0xb] = local_10[2];
    auVar86._8_3_ = local_10._0_3_;
    auVar86[0xc] = local_10[2];
    auVar86[0xd] = local_10[2];
    auVar86[0xe] = local_10[2];
    auVar86[7] = local_10[2];
    auVar85._8_8_ = 0;
    auVar85._0_8_ = CONCAT71(0,bVar71);
    auVar86[0xf] = 0;
    auVar85 = paddsb(auVar85,auVar86 << 8);
    profile_local = (parasail_profile_t *)parasail_result_new_stats();
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar75 = *(uint *)&profile_local->field_0xc | 0x10110401;
      len = (size_t)uVar75;
      *(uint *)&profile_local->field_0xc = uVar75;
      b = parasail_memalign___m128i(0x10,(long)iVar73);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar73);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar73);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr = parasail_memalign___m128i(0x10,(long)iVar73);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar73);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar73);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar73);
      ptr_06 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar133[0] = (long)iVar73;
        alVar133[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar133,len);
        alVar134[0] = (long)iVar73;
        alVar134[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar134,len);
        alVar135[0] = (long)iVar73;
        alVar135[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar135,len);
        alVar136[0] = (long)iVar73;
        alVar136[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar136,len);
        c[0] = (long)iVar73;
        c[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c,len);
        c_00[0] = (long)iVar73;
        c_00[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_00,len);
        c_01[0] = (long)iVar73;
        c_01[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_01,len);
        auVar87._8_8_ = uVar11;
        auVar87._0_8_ = uVar8;
        register0x00001200 = psubsb(ZEXT816(0),auVar87);
        vGapperL[0] = 0x101010101010101;
        _segNum = 0x101010101010101;
        k = iVar73;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          auVar89._8_8_ = uVar12;
          auVar89._0_8_ = uVar9;
          register0x00001200 = psubsb(stack0xffffffffffffee58,auVar89);
          auVar88._8_8_ = 0x101010101010101;
          auVar88._0_8_ = 0x101010101010101;
          _segNum = paddsb(_segNum,auVar88);
        }
        local_11bc = 0;
        for (k = 0; k < iVar73; k = k + 1) {
          for (local_11c0 = 0; local_11c0 < 0x10; local_11c0 = local_11c0 + 1) {
            iVar74 = -(gap * (local_11c0 * iVar73 + k)) - open;
            if (iVar74 < -0x80) {
              iVar74 = -0x80;
            }
            *(char *)((long)&tmp + (long)local_11c0) = (char)iVar74;
          }
          ptr[local_11bc][0] = tmp;
          ptr[local_11bc][1] = h.m[0];
          local_11bc = local_11bc + 1;
        }
        *ptr_06 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar74 = -(gap * (k + -1)) - open;
          if (iVar74 < -0x80) {
            iVar74 = -0x80;
          }
          ptr_06[k] = (int8_t)iVar74;
        }
        vNegInfFront[1] = lVar10;
        vSaturationCheckMax[0] = lVar13;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar109 = ptr[iVar73 + -1][0];
          uVar108 = b_03[iVar73 + -1][0];
          uVar14 = b_04[iVar73 + -1][0];
          uVar15 = b_05[iVar73 + -1][0];
          vHpM[0] = b_03[iVar73 + -1][1] << 8 | uVar108 >> 0x38;
          vHpS[1] = uVar108 << 8;
          vHpS[0] = b_04[iVar73 + -1][1] << 8 | uVar14 >> 0x38;
          vHpL[1] = uVar14 << 8;
          vHpL[0] = b_05[iVar73 + -1][1] << 8 | uVar15 >> 0x38;
          pvW = (__m128i *)(uVar15 << 8);
          vHp[0] = ptr[iVar73 + -1][1] << 8 | uVar109 >> 0x38;
          vHpM[1] = uVar109 << 8 | (ulong)(byte)ptr_06[s1Len];
          iVar74 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar4->mapper[(byte)s2[s1Len]];
          auVar90._8_8_ = lVar13;
          auVar90._0_8_ = lVar10;
          register0x00001200 = psubsb(auVar90,(undefined1  [16])*ptr_04);
          vF[0] = lVar13;
          vF_ext[1] = lVar10;
          stack0xffffffffffffed38 = ZEXT816(0);
          stack0xffffffffffffed28 = ZEXT816(0);
          stack0xffffffffffffed18 = ZEXT816(0);
          k = 0;
          while( true ) {
            auVar86 = stack0xffffffffffffeda8;
            local_7b8 = (char)vF_ext[1];
            cStack_7b7 = vF_ext[1]._1_1_;
            cStack_7b6 = vF_ext[1]._2_1_;
            cStack_7b5 = vF_ext[1]._3_1_;
            cStack_7b4 = vF_ext[1]._4_1_;
            cStack_7b3 = vF_ext[1]._5_1_;
            cStack_7b2 = vF_ext[1]._6_1_;
            cStack_7b1 = vF_ext[1]._7_1_;
            cStack_7b0 = (char)vF_ext[2];
            cStack_7af = vF_ext[2]._1_1_;
            cStack_7ae = vF_ext[2]._2_1_;
            cStack_7ad = vF_ext[2]._3_1_;
            cStack_7ac = vF_ext[2]._4_1_;
            cStack_7ab = vF_ext[2]._5_1_;
            cStack_7aa = vF_ext[2]._6_1_;
            cStack_7a9 = vF_ext[2]._7_1_;
            if (iVar73 <= k) break;
            alVar133 = ptr[k];
            alVar134 = b_03[k];
            alVar135 = b_04[k];
            alVar136 = b_05[k];
            auVar31._8_8_ = uVar11;
            auVar31._0_8_ = uVar8;
            auVar86 = psubsb((undefined1  [16])ptr[k],auVar31);
            auVar30._8_8_ = uVar12;
            auVar30._0_8_ = uVar9;
            auVar87 = psubsb((undefined1  [16])b[k],auVar30);
            local_938 = auVar86[0];
            cStack_937 = auVar86[1];
            cStack_936 = auVar86[2];
            cStack_935 = auVar86[3];
            cStack_934 = auVar86[4];
            cStack_933 = auVar86[5];
            cStack_932 = auVar86[6];
            cStack_931 = auVar86[7];
            cStack_930 = auVar86[8];
            cStack_92f = auVar86[9];
            cStack_92e = auVar86[10];
            cStack_92d = auVar86[0xb];
            cStack_92c = auVar86[0xc];
            cStack_92b = auVar86[0xd];
            cStack_92a = auVar86[0xe];
            cStack_929 = auVar86[0xf];
            local_948 = auVar87[0];
            cStack_947 = auVar87[1];
            cStack_946 = auVar87[2];
            cStack_945 = auVar87[3];
            cStack_944 = auVar87[4];
            cStack_943 = auVar87[5];
            cStack_942 = auVar87[6];
            cStack_941 = auVar87[7];
            cStack_940 = auVar87[8];
            cStack_93f = auVar87[9];
            cStack_93e = auVar87[10];
            cStack_93d = auVar87[0xb];
            cStack_93c = auVar87[0xc];
            cStack_93b = auVar87[0xd];
            cStack_93a = auVar87[0xe];
            cStack_939 = auVar87[0xf];
            case2[1]._0_2_ = CONCAT11(-(cStack_947 < cStack_937),-(local_948 < local_938));
            case2[1]._0_3_ = CONCAT12(-(cStack_946 < cStack_936),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_945 < cStack_935),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_944 < cStack_934),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_943 < cStack_933),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_942 < cStack_932),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_941 < cStack_931),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_93f < cStack_92f),-(cStack_940 < cStack_930));
            case1[0]._0_3_ = CONCAT12(-(cStack_93e < cStack_92e),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_93d < cStack_92d),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_93c < cStack_92c),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_93b < cStack_92b),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_93a < cStack_92a),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_939 < cStack_929),(undefined7)case1[0]);
            bVar77 = (local_938 < local_948) * local_948 | (local_938 >= local_948) * local_938;
            bVar91 = (cStack_937 < cStack_947) * cStack_947 |
                     (cStack_937 >= cStack_947) * cStack_937;
            bVar93 = (cStack_936 < cStack_946) * cStack_946 |
                     (cStack_936 >= cStack_946) * cStack_936;
            bVar95 = (cStack_935 < cStack_945) * cStack_945 |
                     (cStack_935 >= cStack_945) * cStack_935;
            bVar97 = (cStack_934 < cStack_944) * cStack_944 |
                     (cStack_934 >= cStack_944) * cStack_934;
            bVar99 = (cStack_933 < cStack_943) * cStack_943 |
                     (cStack_933 >= cStack_943) * cStack_933;
            bVar101 = (cStack_932 < cStack_942) * cStack_942 |
                      (cStack_932 >= cStack_942) * cStack_932;
            bVar103 = (cStack_931 < cStack_941) * cStack_941 |
                      (cStack_931 >= cStack_941) * cStack_931;
            bVar105 = (cStack_930 < cStack_940) * cStack_940 |
                      (cStack_930 >= cStack_940) * cStack_930;
            bVar110 = (cStack_92f < cStack_93f) * cStack_93f |
                      (cStack_92f >= cStack_93f) * cStack_92f;
            bVar113 = (cStack_92e < cStack_93e) * cStack_93e |
                      (cStack_92e >= cStack_93e) * cStack_92e;
            bVar116 = (cStack_92d < cStack_93d) * cStack_93d |
                      (cStack_92d >= cStack_93d) * cStack_92d;
            bVar119 = (cStack_92c < cStack_93c) * cStack_93c |
                      (cStack_92c >= cStack_93c) * cStack_92c;
            bVar122 = (cStack_92b < cStack_93b) * cStack_93b |
                      (cStack_92b >= cStack_93b) * cStack_92b;
            bVar125 = (cStack_92a < cStack_93a) * cStack_93a |
                      (cStack_92a >= cStack_93a) * cStack_92a;
            bVar128 = (cStack_929 < cStack_939) * cStack_939 |
                      (cStack_929 >= cStack_939) * cStack_929;
            vE_ext[1] = CONCAT17(bVar103,CONCAT16(bVar101,CONCAT15(bVar99,CONCAT14(bVar97,CONCAT13(
                                                  bVar95,CONCAT12(bVar93,CONCAT11(bVar91,bVar77)))))
                                                 ));
            vE[0] = CONCAT17(bVar128,CONCAT16(bVar125,CONCAT15(bVar122,CONCAT14(bVar119,CONCAT13(
                                                  bVar116,CONCAT12(bVar113,CONCAT11(bVar110,bVar105)
                                                                  ))))));
            auVar68._8_8_ = case1[0];
            auVar68._0_8_ = case2[1];
            auVar131 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])b_03[k],auVar68);
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            auVar132 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])b_04[k],auVar67);
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            auVar86 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])b_05[k],auVar66);
            auVar26._8_8_ = 0x101010101010101;
            auVar26._0_8_ = 0x101010101010101;
            auVar86 = paddsb(auVar86,auVar26);
            auVar87 = paddsb(stack0xffffffffffffeda8,(undefined1  [16])ptr_04[k]);
            local_968 = auVar87[0];
            cStack_967 = auVar87[1];
            cStack_966 = auVar87[2];
            cStack_965 = auVar87[3];
            cStack_964 = auVar87[4];
            cStack_963 = auVar87[5];
            cStack_962 = auVar87[6];
            cStack_961 = auVar87[7];
            cStack_960 = auVar87[8];
            cStack_95f = auVar87[9];
            cStack_95e = auVar87[10];
            cStack_95d = auVar87[0xb];
            cStack_95c = auVar87[0xc];
            cStack_95b = auVar87[0xd];
            cStack_95a = auVar87[0xe];
            cStack_959 = auVar87[0xf];
            uVar109 = CONCAT17(-(cStack_961 < cStack_7b1),
                               CONCAT16(-(cStack_962 < cStack_7b2),
                                        CONCAT15(-(cStack_963 < cStack_7b3),
                                                 CONCAT14(-(cStack_964 < cStack_7b4),
                                                          CONCAT13(-(cStack_965 < cStack_7b5),
                                                                   CONCAT12(-(cStack_966 <
                                                                             cStack_7b6),
                                                                            CONCAT11(-(cStack_967 <
                                                                                      cStack_7b7),
                                                                                     -(local_968 <
                                                                                      local_7b8)))))
                                                ))) |
                      CONCAT17(-(cStack_7b1 == cStack_961),
                               CONCAT16(-(cStack_7b2 == cStack_962),
                                        CONCAT15(-(cStack_7b3 == cStack_963),
                                                 CONCAT14(-(cStack_7b4 == cStack_964),
                                                          CONCAT13(-(cStack_7b5 == cStack_965),
                                                                   CONCAT12(-(cStack_7b6 ==
                                                                             cStack_966),
                                                                            CONCAT11(-(cStack_7b7 ==
                                                                                      cStack_967),
                                                                                     -(local_7b8 ==
                                                                                      local_968)))))
                                                )));
            uVar108 = CONCAT17(-(cStack_959 < cStack_7a9),
                               CONCAT16(-(cStack_95a < cStack_7aa),
                                        CONCAT15(-(cStack_95b < cStack_7ab),
                                                 CONCAT14(-(cStack_95c < cStack_7ac),
                                                          CONCAT13(-(cStack_95d < cStack_7ad),
                                                                   CONCAT12(-(cStack_95e <
                                                                             cStack_7ae),
                                                                            CONCAT11(-(cStack_95f <
                                                                                      cStack_7af),
                                                                                     -(cStack_960 <
                                                                                      cStack_7b0))))
                                                         )))) |
                      CONCAT17(-(cStack_7a9 == cStack_959),
                               CONCAT16(-(cStack_7aa == cStack_95a),
                                        CONCAT15(-(cStack_7ab == cStack_95b),
                                                 CONCAT14(-(cStack_7ac == cStack_95c),
                                                          CONCAT13(-(cStack_7ad == cStack_95d),
                                                                   CONCAT12(-(cStack_7ae ==
                                                                             cStack_95e),
                                                                            CONCAT11(-(cStack_7af ==
                                                                                      cStack_95f),
                                                                                     -(cStack_7b0 ==
                                                                                      cStack_960))))
                                                         ))));
            vF_ext[1]._0_2_ =
                 CONCAT11((cStack_7b7 < cStack_967) * cStack_967 |
                          (cStack_7b7 >= cStack_967) * cStack_7b7,
                          (local_7b8 < local_968) * local_968 | (local_7b8 >= local_968) * local_7b8
                         );
            vF_ext[1]._0_3_ =
                 CONCAT12((cStack_7b6 < cStack_966) * cStack_966 |
                          (cStack_7b6 >= cStack_966) * cStack_7b6,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ =
                 CONCAT13((cStack_7b5 < cStack_965) * cStack_965 |
                          (cStack_7b5 >= cStack_965) * cStack_7b5,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ =
                 CONCAT14((cStack_7b4 < cStack_964) * cStack_964 |
                          (cStack_7b4 >= cStack_964) * cStack_7b4,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ =
                 CONCAT15((cStack_7b3 < cStack_963) * cStack_963 |
                          (cStack_7b3 >= cStack_963) * cStack_7b3,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ =
                 CONCAT16((cStack_7b2 < cStack_962) * cStack_962 |
                          (cStack_7b2 >= cStack_962) * cStack_7b2,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17((cStack_7b1 < cStack_961) * cStack_961 |
                                 (cStack_7b1 >= cStack_961) * cStack_7b1,(undefined7)vF_ext[1]);
            vF[0]._0_1_ = (cStack_7b0 < cStack_960) * cStack_960 |
                          (cStack_7b0 >= cStack_960) * cStack_7b0;
            vF[0]._1_1_ = (cStack_7af < cStack_95f) * cStack_95f |
                          (cStack_7af >= cStack_95f) * cStack_7af;
            vF[0]._2_1_ = (cStack_7ae < cStack_95e) * cStack_95e |
                          (cStack_7ae >= cStack_95e) * cStack_7ae;
            vF[0]._3_1_ = (cStack_7ad < cStack_95d) * cStack_95d |
                          (cStack_7ad >= cStack_95d) * cStack_7ad;
            vF[0]._4_1_ = (cStack_7ac < cStack_95c) * cStack_95c |
                          (cStack_7ac >= cStack_95c) * cStack_7ac;
            vF[0]._5_1_ = (cStack_7ab < cStack_95b) * cStack_95b |
                          (cStack_7ab >= cStack_95b) * cStack_7ab;
            vF[0]._6_1_ = (cStack_7aa < cStack_95a) * cStack_95a |
                          (cStack_7aa >= cStack_95a) * cStack_7aa;
            vF[0]._7_1_ = (cStack_7a9 < cStack_959) * cStack_959 |
                          (cStack_7a9 >= cStack_959) * cStack_7a9;
            auVar65._8_8_ = uVar108;
            auVar65._0_8_ = uVar109;
            register0x00001240 = pblendvb(stack0xffffffffffffed98,stack0xffffffffffffed38,auVar65);
            auVar64._8_8_ = uVar108;
            auVar64._0_8_ = uVar109;
            register0x00001240 = pblendvb(stack0xffffffffffffed88,stack0xffffffffffffed28,auVar64);
            auVar87 = paddsb(stack0xffffffffffffed78,(undefined1  [16])ptr_05[k]);
            auVar63._8_8_ = uVar108;
            auVar63._0_8_ = uVar109;
            register0x00001240 = pblendvb(auVar87,stack0xffffffffffffed18,auVar63);
            auVar87 = paddsb((undefined1  [16])stack0xffffffffffffecc8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar74 * iVar73) * 0x10));
            auVar88 = paddsb((undefined1  [16])stack0xffffffffffffecb8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar73) * 0x10));
            auVar89 = paddsb((undefined1  [16])stack0xffffffffffffeca8,
                             *(undefined1 (*) [16])
                              ((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar73) * 0x10));
            auVar25._8_8_ = 0x101010101010101;
            auVar25._0_8_ = 0x101010101010101;
            auVar90 = paddsb((undefined1  [16])_pvW,auVar25);
            vHpM[1] = auVar87._0_8_;
            vHp[0] = auVar87._8_8_;
            local_988 = auVar87[0];
            cStack_987 = auVar87[1];
            cStack_986 = auVar87[2];
            cStack_985 = auVar87[3];
            cStack_984 = auVar87[4];
            cStack_983 = auVar87[5];
            cStack_982 = auVar87[6];
            cStack_981 = auVar87[7];
            cStack_980 = auVar87[8];
            cStack_97f = auVar87[9];
            cStack_97e = auVar87[10];
            cStack_97d = auVar87[0xb];
            cStack_97c = auVar87[0xc];
            cStack_97b = auVar87[0xd];
            cStack_97a = auVar87[0xe];
            cStack_979 = auVar87[0xf];
            case2[1]._0_2_ = CONCAT11(-(cStack_987 < (char)bVar91),-(local_988 < (char)bVar77));
            case2[1]._0_3_ = CONCAT12(-(cStack_986 < (char)bVar93),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_985 < (char)bVar95),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_984 < (char)bVar97),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_983 < (char)bVar99),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_982 < (char)bVar101),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_981 < (char)bVar103),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_97f < (char)bVar110),-(cStack_980 < (char)bVar105));
            case1[0]._0_3_ = CONCAT12(-(cStack_97e < (char)bVar113),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_97d < (char)bVar116),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_97c < (char)bVar119),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_97b < (char)bVar122),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_97a < (char)bVar125),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_979 < (char)bVar128),(undefined7)case1[0]);
            vHtM[1] = CONCAT17(((char)bVar103 < cStack_981) * cStack_981 |
                               ((char)bVar103 >= cStack_981) * bVar103,
                               CONCAT16(((char)bVar101 < cStack_982) * cStack_982 |
                                        ((char)bVar101 >= cStack_982) * bVar101,
                                        CONCAT15(((char)bVar99 < cStack_983) * cStack_983 |
                                                 ((char)bVar99 >= cStack_983) * bVar99,
                                                 CONCAT14(((char)bVar97 < cStack_984) * cStack_984 |
                                                          ((char)bVar97 >= cStack_984) * bVar97,
                                                          CONCAT13(((char)bVar95 < cStack_985) *
                                                                   cStack_985 |
                                                                   ((char)bVar95 >= cStack_985) *
                                                                   bVar95,CONCAT12(((char)bVar93 <
                                                                                   cStack_986) *
                                                                                   cStack_986 |
                                                                                   ((char)bVar93 >=
                                                                                   cStack_986) *
                                                                                   bVar93,CONCAT11((
                                                  (char)bVar91 < cStack_987) * cStack_987 |
                                                  ((char)bVar91 >= cStack_987) * bVar91,
                                                  ((char)bVar77 < local_988) * local_988 |
                                                  ((char)bVar77 >= local_988) * bVar77)))))));
            vHt[0]._0_1_ = ((char)bVar105 < cStack_980) * cStack_980 |
                           ((char)bVar105 >= cStack_980) * bVar105;
            vHt[0]._1_1_ = ((char)bVar110 < cStack_97f) * cStack_97f |
                           ((char)bVar110 >= cStack_97f) * bVar110;
            vHt[0]._2_1_ = ((char)bVar113 < cStack_97e) * cStack_97e |
                           ((char)bVar113 >= cStack_97e) * bVar113;
            vHt[0]._3_1_ = ((char)bVar116 < cStack_97d) * cStack_97d |
                           ((char)bVar116 >= cStack_97d) * bVar116;
            vHt[0]._4_1_ = ((char)bVar119 < cStack_97c) * cStack_97c |
                           ((char)bVar119 >= cStack_97c) * bVar119;
            vHt[0]._5_1_ = ((char)bVar122 < cStack_97b) * cStack_97b |
                           ((char)bVar122 >= cStack_97b) * bVar122;
            vHt[0]._6_1_ = ((char)bVar125 < cStack_97a) * cStack_97a |
                           ((char)bVar125 >= cStack_97a) * bVar125;
            vHt[0]._7_1_ = ((char)bVar128 < cStack_979) * cStack_979 |
                           ((char)bVar128 >= cStack_979) * bVar128;
            vHpS[1] = auVar88._0_8_;
            vHpM[0] = auVar88._8_8_;
            vES[1] = auVar131._0_8_;
            vEM[0] = auVar131._8_8_;
            auVar62._8_8_ = case1[0];
            auVar62._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar88,auVar131,auVar62);
            vHpL[1] = auVar89._0_8_;
            vHpS[0] = auVar89._8_8_;
            vEL[1] = auVar132._0_8_;
            vES[0] = auVar132._8_8_;
            auVar61._8_8_ = case1[0];
            auVar61._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar89,auVar132,auVar61);
            pvW = auVar90._0_8_;
            vHpL[0] = auVar90._8_8_;
            vHt[1] = auVar86._0_8_;
            vEL[0] = auVar86._8_8_;
            auVar60._8_8_ = case1[0];
            auVar60._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar90,auVar86,auVar60);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            _pvW = alVar136;
            unique0x100079ea = alVar135;
            unique0x10007a0a = alVar134;
            unique0x10007a2a = alVar133;
          }
          uVar109 = vHt[0] << 8 | (ulong)vHtM[1] >> 0x38;
          vHt[0] = uVar109;
          vHtM[1] = vHtM[1] << 8;
          lVar79 = vHtS[1] << 8;
          vHtM[0] = vHtM[0] << 8 | (ulong)vHtS[1] >> 0x38;
          vHtS[1] = lVar79;
          lVar80 = vHtL[1] << 8;
          vHtS[0] = vHtS[0] << 8 | (ulong)vHtL[1] >> 0x38;
          vHtL[1] = lVar80;
          lVar81 = vF[1] << 8;
          vHtL[0] = vHtL[0] << 8 | (ulong)vF[1] >> 0x38;
          vF[1] = lVar81;
          cVar78 = ptr_06[(long)s1Len + 1];
          vHtM[1]._0_1_ = cVar78;
          auVar132._8_8_ = uVar109;
          auVar132._0_8_ = vHtM[1];
          auVar87 = paddsb(auVar132,(undefined1  [16])*ptr_04);
          local_998 = auVar87[0];
          cStack_997 = auVar87[1];
          cStack_996 = auVar87[2];
          cStack_995 = auVar87[3];
          cStack_994 = auVar87[4];
          cStack_993 = auVar87[5];
          cStack_992 = auVar87[6];
          cStack_991 = auVar87[7];
          cStack_990 = auVar87[8];
          cStack_98f = auVar87[9];
          cStack_98e = auVar87[10];
          cStack_98d = auVar87[0xb];
          cStack_98c = auVar87[0xc];
          cStack_98b = auVar87[0xd];
          cStack_98a = auVar87[0xe];
          cStack_989 = auVar87[0xf];
          uVar109 = CONCAT17(-(cStack_7b1 < cStack_991),
                             CONCAT16(-(cStack_7b2 < cStack_992),
                                      CONCAT15(-(cStack_7b3 < cStack_993),
                                               CONCAT14(-(cStack_7b4 < cStack_994),
                                                        CONCAT13(-(cStack_7b5 < cStack_995),
                                                                 CONCAT12(-(cStack_7b6 < cStack_996)
                                                                          ,CONCAT11(-(cStack_7b7 <
                                                                                     cStack_997),
                                                                                    -(local_7b8 <
                                                                                     local_998))))))
                                     )) |
                    CONCAT17(-(cStack_991 == cStack_7b1),
                             CONCAT16(-(cStack_992 == cStack_7b2),
                                      CONCAT15(-(cStack_993 == cStack_7b3),
                                               CONCAT14(-(cStack_994 == cStack_7b4),
                                                        CONCAT13(-(cStack_995 == cStack_7b5),
                                                                 CONCAT12(-(cStack_996 == cStack_7b6
                                                                           ),CONCAT11(-(cStack_997
                                                                                       == cStack_7b7
                                                                                       ),-(local_998
                                                                                          == 
                                                  local_7b8))))))));
          uVar108 = CONCAT17(-(cStack_7a9 < cStack_989),
                             CONCAT16(-(cStack_7aa < cStack_98a),
                                      CONCAT15(-(cStack_7ab < cStack_98b),
                                               CONCAT14(-(cStack_7ac < cStack_98c),
                                                        CONCAT13(-(cStack_7ad < cStack_98d),
                                                                 CONCAT12(-(cStack_7ae < cStack_98e)
                                                                          ,CONCAT11(-(cStack_7af <
                                                                                     cStack_98f),
                                                                                    -(cStack_7b0 <
                                                                                     cStack_990)))))
                                              ))) |
                    CONCAT17(-(cStack_989 == cStack_7a9),
                             CONCAT16(-(cStack_98a == cStack_7aa),
                                      CONCAT15(-(cStack_98b == cStack_7ab),
                                               CONCAT14(-(cStack_98c == cStack_7ac),
                                                        CONCAT13(-(cStack_98d == cStack_7ad),
                                                                 CONCAT12(-(cStack_98e == cStack_7ae
                                                                           ),CONCAT11(-(cStack_98f
                                                                                       == cStack_7af
                                                                                       ),-(
                                                  cStack_990 == cStack_7b0))))))));
          vF_ext[1]._0_2_ =
               CONCAT11((cStack_7b7 < cStack_997) * cStack_997 |
                        (cStack_7b7 >= cStack_997) * cStack_7b7,
                        (local_7b8 < local_998) * local_998 | (local_7b8 >= local_998) * local_7b8);
          vF_ext[1]._0_3_ =
               CONCAT12((cStack_7b6 < cStack_996) * cStack_996 |
                        (cStack_7b6 >= cStack_996) * cStack_7b6,(undefined2)vF_ext[1]);
          vF_ext[1]._0_4_ =
               CONCAT13((cStack_7b5 < cStack_995) * cStack_995 |
                        (cStack_7b5 >= cStack_995) * cStack_7b5,(undefined3)vF_ext[1]);
          vF_ext[1]._0_5_ =
               CONCAT14((cStack_7b4 < cStack_994) * cStack_994 |
                        (cStack_7b4 >= cStack_994) * cStack_7b4,(undefined4)vF_ext[1]);
          vF_ext[1]._0_6_ =
               CONCAT15((cStack_7b3 < cStack_993) * cStack_993 |
                        (cStack_7b3 >= cStack_993) * cStack_7b3,(undefined5)vF_ext[1]);
          vF_ext[1]._0_7_ =
               CONCAT16((cStack_7b2 < cStack_992) * cStack_992 |
                        (cStack_7b2 >= cStack_992) * cStack_7b2,(undefined6)vF_ext[1]);
          vF_ext[1] = CONCAT17((cStack_7b1 < cStack_991) * cStack_991 |
                               (cStack_7b1 >= cStack_991) * cStack_7b1,(undefined7)vF_ext[1]);
          vF[0]._0_1_ = (cStack_7b0 < cStack_990) * cStack_990 |
                        (cStack_7b0 >= cStack_990) * cStack_7b0;
          vF[0]._1_1_ = (cStack_7af < cStack_98f) * cStack_98f |
                        (cStack_7af >= cStack_98f) * cStack_7af;
          vF[0]._2_1_ = (cStack_7ae < cStack_98e) * cStack_98e |
                        (cStack_7ae >= cStack_98e) * cStack_7ae;
          vF[0]._3_1_ = (cStack_7ad < cStack_98d) * cStack_98d |
                        (cStack_7ad >= cStack_98d) * cStack_7ad;
          vF[0]._4_1_ = (cStack_7ac < cStack_98c) * cStack_98c |
                        (cStack_7ac >= cStack_98c) * cStack_7ac;
          vF[0]._5_1_ = (cStack_7ab < cStack_98b) * cStack_98b |
                        (cStack_7ab >= cStack_98b) * cStack_7ab;
          vF[0]._6_1_ = (cStack_7aa < cStack_98a) * cStack_98a |
                        (cStack_7aa >= cStack_98a) * cStack_7aa;
          vF[0]._7_1_ = (cStack_7a9 < cStack_989) * cStack_989 |
                        (cStack_7a9 >= cStack_989) * cStack_7a9;
          auVar59._8_8_ = vHtM[0];
          auVar59._0_8_ = lVar79;
          auVar58._8_8_ = uVar108;
          auVar58._0_8_ = uVar109;
          register0x00001240 = pblendvb(stack0xffffffffffffed38,auVar59,auVar58);
          auVar57._8_8_ = vHtS[0];
          auVar57._0_8_ = lVar80;
          auVar56._8_8_ = uVar108;
          auVar56._0_8_ = uVar109;
          register0x00001240 = pblendvb(stack0xffffffffffffed28,auVar57,auVar56);
          auVar131._8_8_ = vHtL[0];
          auVar131._0_8_ = lVar81;
          auVar87 = paddsb(auVar131,(undefined1  [16])*ptr_05);
          auVar55._8_8_ = uVar108;
          auVar55._0_8_ = uVar109;
          register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar87,auVar55);
          k = 0;
          while( true ) {
            if (0xd < k) break;
            auVar24._8_8_ = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
            auVar24._0_8_ = vF_ext[1] << 8;
            auVar87 = paddsb(auVar24,auVar85);
            local_9b8 = auVar87[0];
            cStack_9b7 = auVar87[1];
            cStack_9b6 = auVar87[2];
            cStack_9b5 = auVar87[3];
            cStack_9b4 = auVar87[4];
            cStack_9b3 = auVar87[5];
            cStack_9b2 = auVar87[6];
            cStack_9b1 = auVar87[7];
            cStack_9b0 = auVar87[8];
            cStack_9af = auVar87[9];
            cStack_9ae = auVar87[10];
            cStack_9ad = auVar87[0xb];
            cStack_9ac = auVar87[0xc];
            cStack_9ab = auVar87[0xd];
            cStack_9aa = auVar87[0xe];
            cStack_9a9 = auVar87[0xf];
            local_9c8 = (char)vF_ext[1];
            cStack_9c7 = vF_ext[1]._1_1_;
            cStack_9c6 = vF_ext[1]._2_1_;
            cStack_9c5 = vF_ext[1]._3_1_;
            cStack_9c4 = vF_ext[1]._4_1_;
            cStack_9c3 = vF_ext[1]._5_1_;
            cStack_9c2 = vF_ext[1]._6_1_;
            cStack_9c1 = vF_ext[1]._7_1_;
            cStack_9c0 = (char)vF_ext[2];
            cStack_9bf = vF_ext[2]._1_1_;
            cStack_9be = vF_ext[2]._2_1_;
            cStack_9bd = vF_ext[2]._3_1_;
            cStack_9bc = vF_ext[2]._4_1_;
            cStack_9bb = vF_ext[2]._5_1_;
            cStack_9ba = vF_ext[2]._6_1_;
            cStack_9b9 = vF_ext[2]._7_1_;
            uVar109 = CONCAT17(-(cStack_9c1 < cStack_9b1),
                               CONCAT16(-(cStack_9c2 < cStack_9b2),
                                        CONCAT15(-(cStack_9c3 < cStack_9b3),
                                                 CONCAT14(-(cStack_9c4 < cStack_9b4),
                                                          CONCAT13(-(cStack_9c5 < cStack_9b5),
                                                                   CONCAT12(-(cStack_9c6 <
                                                                             cStack_9b6),
                                                                            CONCAT11(-(cStack_9c7 <
                                                                                      cStack_9b7),
                                                                                     -(local_9c8 <
                                                                                      local_9b8)))))
                                                ))) |
                      CONCAT17(-(cStack_9b1 == cStack_9c1),
                               CONCAT16(-(cStack_9b2 == cStack_9c2),
                                        CONCAT15(-(cStack_9b3 == cStack_9c3),
                                                 CONCAT14(-(cStack_9b4 == cStack_9c4),
                                                          CONCAT13(-(cStack_9b5 == cStack_9c5),
                                                                   CONCAT12(-(cStack_9b6 ==
                                                                             cStack_9c6),
                                                                            CONCAT11(-(cStack_9b7 ==
                                                                                      cStack_9c7),
                                                                                     -(local_9b8 ==
                                                                                      local_9c8)))))
                                                )));
            uVar108 = CONCAT17(-(cStack_9b9 < cStack_9a9),
                               CONCAT16(-(cStack_9ba < cStack_9aa),
                                        CONCAT15(-(cStack_9bb < cStack_9ab),
                                                 CONCAT14(-(cStack_9bc < cStack_9ac),
                                                          CONCAT13(-(cStack_9bd < cStack_9ad),
                                                                   CONCAT12(-(cStack_9be <
                                                                             cStack_9ae),
                                                                            CONCAT11(-(cStack_9bf <
                                                                                      cStack_9af),
                                                                                     -(cStack_9c0 <
                                                                                      cStack_9b0))))
                                                         )))) |
                      CONCAT17(-(cStack_9a9 == cStack_9b9),
                               CONCAT16(-(cStack_9aa == cStack_9ba),
                                        CONCAT15(-(cStack_9ab == cStack_9bb),
                                                 CONCAT14(-(cStack_9ac == cStack_9bc),
                                                          CONCAT13(-(cStack_9ad == cStack_9bd),
                                                                   CONCAT12(-(cStack_9ae ==
                                                                             cStack_9be),
                                                                            CONCAT11(-(cStack_9af ==
                                                                                      cStack_9bf),
                                                                                     -(cStack_9b0 ==
                                                                                      cStack_9c0))))
                                                         ))));
            vF_ext[1]._0_2_ =
                 CONCAT11((cStack_9c7 < cStack_9b7) * cStack_9b7 |
                          (cStack_9c7 >= cStack_9b7) * cStack_9c7,
                          (local_9c8 < local_9b8) * local_9b8 | (local_9c8 >= local_9b8) * local_9c8
                         );
            vF_ext[1]._0_3_ =
                 CONCAT12((cStack_9c6 < cStack_9b6) * cStack_9b6 |
                          (cStack_9c6 >= cStack_9b6) * cStack_9c6,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ =
                 CONCAT13((cStack_9c5 < cStack_9b5) * cStack_9b5 |
                          (cStack_9c5 >= cStack_9b5) * cStack_9c5,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ =
                 CONCAT14((cStack_9c4 < cStack_9b4) * cStack_9b4 |
                          (cStack_9c4 >= cStack_9b4) * cStack_9c4,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ =
                 CONCAT15((cStack_9c3 < cStack_9b3) * cStack_9b3 |
                          (cStack_9c3 >= cStack_9b3) * cStack_9c3,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ =
                 CONCAT16((cStack_9c2 < cStack_9b2) * cStack_9b2 |
                          (cStack_9c2 >= cStack_9b2) * cStack_9c2,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17((cStack_9c1 < cStack_9b1) * cStack_9b1 |
                                 (cStack_9c1 >= cStack_9b1) * cStack_9c1,(undefined7)vF_ext[1]);
            vF[0]._0_1_ = (cStack_9c0 < cStack_9b0) * cStack_9b0 |
                          (cStack_9c0 >= cStack_9b0) * cStack_9c0;
            vF[0]._1_1_ = (cStack_9bf < cStack_9af) * cStack_9af |
                          (cStack_9bf >= cStack_9af) * cStack_9bf;
            vF[0]._2_1_ = (cStack_9be < cStack_9ae) * cStack_9ae |
                          (cStack_9be >= cStack_9ae) * cStack_9be;
            vF[0]._3_1_ = (cStack_9bd < cStack_9ad) * cStack_9ad |
                          (cStack_9bd >= cStack_9ad) * cStack_9bd;
            vF[0]._4_1_ = (cStack_9bc < cStack_9ac) * cStack_9ac |
                          (cStack_9bc >= cStack_9ac) * cStack_9bc;
            vF[0]._5_1_ = (cStack_9bb < cStack_9ab) * cStack_9ab |
                          (cStack_9bb >= cStack_9ab) * cStack_9bb;
            vF[0]._6_1_ = (cStack_9ba < cStack_9aa) * cStack_9aa |
                          (cStack_9ba >= cStack_9aa) * cStack_9ba;
            vF[0]._7_1_ = (cStack_9b9 < cStack_9a9) * cStack_9a9 |
                          (cStack_9b9 >= cStack_9a9) * cStack_9b9;
            auVar54._8_8_ = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
            auVar54._0_8_ = vFS[1] << 8;
            auVar53._8_8_ = uVar108;
            auVar53._0_8_ = uVar109;
            register0x00001240 = pblendvb(stack0xffffffffffffed38,auVar54,auVar53);
            auVar52._8_8_ = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
            auVar52._0_8_ = vFL[1] << 8;
            auVar51._8_8_ = uVar108;
            auVar51._0_8_ = uVar109;
            register0x00001240 = pblendvb(stack0xffffffffffffed28,auVar52,auVar51);
            auVar23._8_8_ = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
            auVar23._0_8_ = vH[1] << 8;
            auVar70[0xf] = 0;
            auVar87 = paddsb(auVar23,auVar70 << 8);
            auVar50._8_8_ = uVar108;
            auVar50._0_8_ = uVar109;
            register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar87,auVar50);
            k = k + 1;
          }
          lVar82 = vFS[1] << 8;
          vFM[0] = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
          vFS[1] = lVar82;
          lVar83 = vFL[1] << 8;
          vFS[0] = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
          vFL[1] = lVar83;
          lVar84 = vH[1] << 8;
          vFL[0] = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
          vH[1] = lVar84;
          auVar22._8_8_ = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
          auVar22._0_8_ = vF_ext[1] << 8;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = CONCAT71(0,bVar71);
          register0x00001200 = paddsb(auVar22,auVar21);
          local_9d8 = (char)vF_ext[1];
          cStack_9d7 = vF_ext[1]._1_1_;
          cStack_9d6 = vF_ext[1]._2_1_;
          cStack_9d5 = vF_ext[1]._3_1_;
          cStack_9d4 = vF_ext[1]._4_1_;
          cStack_9d3 = vF_ext[1]._5_1_;
          cStack_9d2 = vF_ext[1]._6_1_;
          cStack_9d1 = vF_ext[1]._7_1_;
          cStack_9d0 = (char)vF_ext[2];
          cStack_9cf = vF_ext[2]._1_1_;
          cStack_9ce = vF_ext[2]._2_1_;
          cStack_9cd = vF_ext[2]._3_1_;
          cStack_9cc = vF_ext[2]._4_1_;
          cStack_9cb = vF_ext[2]._5_1_;
          cStack_9ca = vF_ext[2]._6_1_;
          cStack_9c9 = vF_ext[2]._7_1_;
          cStack_9e7 = auVar86[0];
          cStack_9e6 = auVar86[1];
          cStack_9e5 = auVar86[2];
          cStack_9e4 = auVar86[3];
          cStack_9e3 = auVar86[4];
          cStack_9e2 = auVar86[5];
          cStack_9e1 = auVar86[6];
          cStack_9e0 = auVar86[7];
          cStack_9df = auVar86[8];
          cStack_9de = auVar86[9];
          cStack_9dd = auVar86[10];
          cStack_9dc = auVar86[0xb];
          cStack_9db = auVar86[0xc];
          cStack_9da = auVar86[0xd];
          cStack_9d9 = auVar86[0xe];
          case2[1]._0_2_ = CONCAT11(-(cStack_9e7 < cStack_9d7),-(cVar78 < local_9d8));
          case2[1]._0_3_ = CONCAT12(-(cStack_9e6 < cStack_9d6),(undefined2)case2[1]);
          case2[1]._0_4_ = CONCAT13(-(cStack_9e5 < cStack_9d5),(undefined3)case2[1]);
          case2[1]._0_5_ = CONCAT14(-(cStack_9e4 < cStack_9d4),(undefined4)case2[1]);
          case2[1]._0_6_ = CONCAT15(-(cStack_9e3 < cStack_9d3),(undefined5)case2[1]);
          case2[1]._0_7_ = CONCAT16(-(cStack_9e2 < cStack_9d2),(undefined6)case2[1]);
          case2[1] = CONCAT17(-(cStack_9e1 < cStack_9d1),(undefined7)case2[1]);
          case1[0]._0_2_ = CONCAT11(-(cStack_9df < cStack_9cf),-(cStack_9e0 < cStack_9d0));
          case1[0]._0_3_ = CONCAT12(-(cStack_9de < cStack_9ce),(undefined2)case1[0]);
          case1[0]._0_4_ = CONCAT13(-(cStack_9dd < cStack_9cd),(undefined3)case1[0]);
          case1[0]._0_5_ = CONCAT14(-(cStack_9dc < cStack_9cc),(undefined4)case1[0]);
          case1[0]._0_6_ = CONCAT15(-(cStack_9db < cStack_9cb),(undefined5)case1[0]);
          case1[0]._0_7_ = CONCAT16(-(cStack_9da < cStack_9ca),(undefined6)case1[0]);
          case1[0] = CONCAT17(-(cStack_9d9 < cStack_9c9),(undefined7)case1[0]);
          vHM[1]._0_2_ = CONCAT11((cStack_9d7 < cStack_9e7) * cStack_9e7 |
                                  (cStack_9d7 >= cStack_9e7) * cStack_9d7,
                                  (local_9d8 < cVar78) * cVar78 | (local_9d8 >= cVar78) * local_9d8)
          ;
          vHM[1]._0_3_ = CONCAT12((cStack_9d6 < cStack_9e6) * cStack_9e6 |
                                  (cStack_9d6 >= cStack_9e6) * cStack_9d6,(undefined2)vHM[1]);
          vHM[1]._0_4_ = CONCAT13((cStack_9d5 < cStack_9e5) * cStack_9e5 |
                                  (cStack_9d5 >= cStack_9e5) * cStack_9d5,(undefined3)vHM[1]);
          vHM[1]._0_5_ = CONCAT14((cStack_9d4 < cStack_9e4) * cStack_9e4 |
                                  (cStack_9d4 >= cStack_9e4) * cStack_9d4,(undefined4)vHM[1]);
          vHM[1]._0_6_ = CONCAT15((cStack_9d3 < cStack_9e3) * cStack_9e3 |
                                  (cStack_9d3 >= cStack_9e3) * cStack_9d3,(undefined5)vHM[1]);
          vHM[1]._0_7_ = CONCAT16((cStack_9d2 < cStack_9e2) * cStack_9e2 |
                                  (cStack_9d2 >= cStack_9e2) * cStack_9d2,(undefined6)vHM[1]);
          vHM[1] = CONCAT17((cStack_9d1 < cStack_9e1) * cStack_9e1 |
                            (cStack_9d1 >= cStack_9e1) * cStack_9d1,(undefined7)vHM[1]);
          vH[0]._0_2_ = CONCAT11((cStack_9cf < cStack_9df) * cStack_9df |
                                 (cStack_9cf >= cStack_9df) * cStack_9cf,
                                 (cStack_9d0 < cStack_9e0) * cStack_9e0 |
                                 (cStack_9d0 >= cStack_9e0) * cStack_9d0);
          vH[0]._0_3_ = CONCAT12((cStack_9ce < cStack_9de) * cStack_9de |
                                 (cStack_9ce >= cStack_9de) * cStack_9ce,(undefined2)vH[0]);
          vH[0]._0_4_ = CONCAT13((cStack_9cd < cStack_9dd) * cStack_9dd |
                                 (cStack_9cd >= cStack_9dd) * cStack_9cd,(undefined3)vH[0]);
          vH[0]._0_5_ = CONCAT14((cStack_9cc < cStack_9dc) * cStack_9dc |
                                 (cStack_9cc >= cStack_9dc) * cStack_9cc,(undefined4)vH[0]);
          vH[0]._0_6_ = CONCAT15((cStack_9cb < cStack_9db) * cStack_9db |
                                 (cStack_9cb >= cStack_9db) * cStack_9cb,(undefined5)vH[0]);
          vH[0]._0_7_ = CONCAT16((cStack_9ca < cStack_9da) * cStack_9da |
                                 (cStack_9ca >= cStack_9da) * cStack_9ca,(undefined6)vH[0]);
          vH[0] = CONCAT17((cStack_9c9 < cStack_9d9) * cStack_9d9 |
                           (cStack_9c9 >= cStack_9d9) * cStack_9c9,(undefined7)vH[0]);
          auVar49._8_8_ = vHtM[0];
          auVar49._0_8_ = lVar79;
          auVar48._8_8_ = vFM[0];
          auVar48._0_8_ = lVar82;
          auVar47._8_8_ = case1[0];
          auVar47._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar49,auVar48,auVar47);
          auVar46._8_8_ = vHtS[0];
          auVar46._0_8_ = lVar80;
          auVar45._8_8_ = vFS[0];
          auVar45._0_8_ = lVar83;
          auVar44._8_8_ = case1[0];
          auVar44._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar46,auVar45,auVar44);
          auVar43._8_8_ = vHtL[0];
          auVar43._0_8_ = lVar81;
          auVar42._8_8_ = vFL[0];
          auVar42._0_8_ = lVar84;
          auVar41._8_8_ = case1[0];
          auVar41._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar43,auVar42,auVar41);
          for (k = 0; k < iVar73; k = k + 1) {
            lVar16 = ptr[k][0];
            lVar17 = ptr[k][1];
            lVar18 = b[k][0];
            lVar19 = b[k][1];
            auVar29._8_8_ = vH[0];
            auVar29._0_8_ = vHM[1];
            auVar28._8_8_ = uVar11;
            auVar28._0_8_ = uVar8;
            auVar86 = psubsb(auVar29,auVar28);
            auVar27._8_8_ = uVar12;
            auVar27._0_8_ = uVar9;
            auVar87 = psubsb(stack0xffffffffffffed68,auVar27);
            local_858 = auVar86[0];
            cStack_857 = auVar86[1];
            cStack_856 = auVar86[2];
            cStack_855 = auVar86[3];
            cStack_854 = auVar86[4];
            cStack_853 = auVar86[5];
            cStack_852 = auVar86[6];
            cStack_851 = auVar86[7];
            cStack_850 = auVar86[8];
            cStack_84f = auVar86[9];
            cStack_84e = auVar86[10];
            cStack_84d = auVar86[0xb];
            cStack_84c = auVar86[0xc];
            cStack_84b = auVar86[0xd];
            cStack_84a = auVar86[0xe];
            cStack_849 = auVar86[0xf];
            local_868 = auVar87[0];
            cStack_867 = auVar87[1];
            cStack_866 = auVar87[2];
            cStack_865 = auVar87[3];
            cStack_864 = auVar87[4];
            cStack_863 = auVar87[5];
            cStack_862 = auVar87[6];
            cStack_861 = auVar87[7];
            cStack_860 = auVar87[8];
            cStack_85f = auVar87[9];
            cStack_85e = auVar87[10];
            cStack_85d = auVar87[0xb];
            cStack_85c = auVar87[0xc];
            cStack_85b = auVar87[0xd];
            cStack_85a = auVar87[0xe];
            cStack_859 = auVar87[0xf];
            bVar77 = (local_858 < local_868) * local_868 | (local_858 >= local_868) * local_858;
            bVar93 = (cStack_857 < cStack_867) * cStack_867 |
                     (cStack_857 >= cStack_867) * cStack_857;
            bVar97 = (cStack_856 < cStack_866) * cStack_866 |
                     (cStack_856 >= cStack_866) * cStack_856;
            bVar101 = (cStack_855 < cStack_865) * cStack_865 |
                      (cStack_855 >= cStack_865) * cStack_855;
            bVar105 = (cStack_854 < cStack_864) * cStack_864 |
                      (cStack_854 >= cStack_864) * cStack_854;
            bVar113 = (cStack_853 < cStack_863) * cStack_863 |
                      (cStack_853 >= cStack_863) * cStack_853;
            bVar119 = (cStack_852 < cStack_862) * cStack_862 |
                      (cStack_852 >= cStack_862) * cStack_852;
            bVar125 = (cStack_851 < cStack_861) * cStack_861 |
                      (cStack_851 >= cStack_861) * cStack_851;
            vF[0]._0_1_ = (cStack_850 < cStack_860) * cStack_860 |
                          (cStack_850 >= cStack_860) * cStack_850;
            vF[0]._1_1_ = (cStack_84f < cStack_85f) * cStack_85f |
                          (cStack_84f >= cStack_85f) * cStack_84f;
            vF[0]._2_1_ = (cStack_84e < cStack_85e) * cStack_85e |
                          (cStack_84e >= cStack_85e) * cStack_84e;
            vF[0]._3_1_ = (cStack_84d < cStack_85d) * cStack_85d |
                          (cStack_84d >= cStack_85d) * cStack_84d;
            vF[0]._4_1_ = (cStack_84c < cStack_85c) * cStack_85c |
                          (cStack_84c >= cStack_85c) * cStack_84c;
            vF[0]._5_1_ = (cStack_84b < cStack_85b) * cStack_85b |
                          (cStack_84b >= cStack_85b) * cStack_84b;
            vF[0]._6_1_ = (cStack_84a < cStack_85a) * cStack_85a |
                          (cStack_84a >= cStack_85a) * cStack_84a;
            vF[0]._7_1_ = (cStack_849 < cStack_859) * cStack_859 |
                          (cStack_849 >= cStack_859) * cStack_849;
            vF_ext[1]._0_2_ = CONCAT11(bVar93,bVar77);
            vF_ext[1]._0_3_ = CONCAT12(bVar97,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ = CONCAT13(bVar101,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ = CONCAT14(bVar105,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ = CONCAT15(bVar113,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ = CONCAT16(bVar119,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17(bVar125,(undefined7)vF_ext[1]);
            case2[1]._0_2_ = CONCAT11(-(cStack_867 < cStack_857),-(local_868 < local_858));
            case2[1]._0_3_ = CONCAT12(-(cStack_866 < cStack_856),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_865 < cStack_855),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_864 < cStack_854),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_863 < cStack_853),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_862 < cStack_852),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_861 < cStack_851),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_85f < cStack_84f),-(cStack_860 < cStack_850));
            case1[0]._0_3_ = CONCAT12(-(cStack_85e < cStack_84e),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_85d < cStack_84d),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_85c < cStack_84c),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_85b < cStack_84b),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_85a < cStack_84a),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_859 < cStack_849),(undefined7)case1[0]);
            auVar40._8_8_ = case1[0];
            auVar40._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed38,stack0xffffffffffffecf8,auVar40);
            auVar39._8_8_ = case1[0];
            auVar39._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed28,stack0xffffffffffffece8,auVar39);
            auVar38._8_8_ = case1[0];
            auVar38._0_8_ = case2[1];
            auVar86 = pblendvb(stack0xffffffffffffed18,stack0xffffffffffffecd8,auVar38);
            auVar20._8_8_ = 0x101010101010101;
            auVar20._0_8_ = 0x101010101010101;
            register0x00001200 = paddsb(auVar86,auVar20);
            local_878 = (byte)lVar16;
            bStack_877 = (byte)((ulong)lVar16 >> 8);
            bStack_876 = (byte)((ulong)lVar16 >> 0x10);
            bStack_875 = (byte)((ulong)lVar16 >> 0x18);
            bStack_874 = (byte)((ulong)lVar16 >> 0x20);
            bStack_873 = (byte)((ulong)lVar16 >> 0x28);
            bStack_872 = (byte)((ulong)lVar16 >> 0x30);
            bStack_871 = (byte)((ulong)lVar16 >> 0x38);
            bStack_870 = (byte)lVar17;
            bStack_86f = (byte)((ulong)lVar17 >> 8);
            bStack_86e = (byte)((ulong)lVar17 >> 0x10);
            bStack_86d = (byte)((ulong)lVar17 >> 0x18);
            bStack_86c = (byte)((ulong)lVar17 >> 0x20);
            bStack_86b = (byte)((ulong)lVar17 >> 0x28);
            bStack_86a = (byte)((ulong)lVar17 >> 0x30);
            bStack_869 = (byte)((ulong)lVar17 >> 0x38);
            local_888 = (char)lVar18;
            cStack_887 = (char)((ulong)lVar18 >> 8);
            cStack_886 = (char)((ulong)lVar18 >> 0x10);
            cStack_885 = (char)((ulong)lVar18 >> 0x18);
            cStack_884 = (char)((ulong)lVar18 >> 0x20);
            cStack_883 = (char)((ulong)lVar18 >> 0x28);
            cStack_882 = (char)((ulong)lVar18 >> 0x30);
            cStack_881 = (char)((ulong)lVar18 >> 0x38);
            cStack_880 = (char)lVar19;
            cStack_87f = (char)((ulong)lVar19 >> 8);
            cStack_87e = (char)((ulong)lVar19 >> 0x10);
            cStack_87d = (char)((ulong)lVar19 >> 0x18);
            cStack_87c = (char)((ulong)lVar19 >> 0x20);
            cStack_87b = (char)((ulong)lVar19 >> 0x28);
            cStack_87a = (char)((ulong)lVar19 >> 0x30);
            cStack_879 = (char)((ulong)lVar19 >> 0x38);
            bVar91 = ((char)local_878 < local_888) * local_888 |
                     ((char)local_878 >= local_888) * local_878;
            bVar95 = ((char)bStack_877 < cStack_887) * cStack_887 |
                     ((char)bStack_877 >= cStack_887) * bStack_877;
            bVar99 = ((char)bStack_876 < cStack_886) * cStack_886 |
                     ((char)bStack_876 >= cStack_886) * bStack_876;
            bVar103 = ((char)bStack_875 < cStack_885) * cStack_885 |
                      ((char)bStack_875 >= cStack_885) * bStack_875;
            bVar110 = ((char)bStack_874 < cStack_884) * cStack_884 |
                      ((char)bStack_874 >= cStack_884) * bStack_874;
            bVar116 = ((char)bStack_873 < cStack_883) * cStack_883 |
                      ((char)bStack_873 >= cStack_883) * bStack_873;
            bVar122 = ((char)bStack_872 < cStack_882) * cStack_882 |
                      ((char)bStack_872 >= cStack_882) * bStack_872;
            bVar128 = ((char)bStack_871 < cStack_881) * cStack_881 |
                      ((char)bStack_871 >= cStack_881) * bStack_871;
            bVar106 = ((char)bStack_870 < cStack_880) * cStack_880 |
                      ((char)bStack_870 >= cStack_880) * bStack_870;
            bVar111 = ((char)bStack_86f < cStack_87f) * cStack_87f |
                      ((char)bStack_86f >= cStack_87f) * bStack_86f;
            bVar114 = ((char)bStack_86e < cStack_87e) * cStack_87e |
                      ((char)bStack_86e >= cStack_87e) * bStack_86e;
            bVar117 = ((char)bStack_86d < cStack_87d) * cStack_87d |
                      ((char)bStack_86d >= cStack_87d) * bStack_86d;
            bVar120 = ((char)bStack_86c < cStack_87c) * cStack_87c |
                      ((char)bStack_86c >= cStack_87c) * bStack_86c;
            bVar123 = ((char)bStack_86b < cStack_87b) * cStack_87b |
                      ((char)bStack_86b >= cStack_87b) * bStack_86b;
            bVar126 = ((char)bStack_86a < cStack_87a) * cStack_87a |
                      ((char)bStack_86a >= cStack_87a) * bStack_86a;
            bVar129 = ((char)bStack_869 < cStack_879) * cStack_879 |
                      ((char)bStack_869 >= cStack_879) * bStack_869;
            bVar91 = ((char)bVar91 < (char)bVar77) * bVar77 |
                     ((char)bVar91 >= (char)bVar77) * bVar91;
            bVar95 = ((char)bVar95 < (char)bVar93) * bVar93 |
                     ((char)bVar95 >= (char)bVar93) * bVar95;
            bVar99 = ((char)bVar99 < (char)bVar97) * bVar97 |
                     ((char)bVar99 >= (char)bVar97) * bVar99;
            bVar103 = ((char)bVar103 < (char)bVar101) * bVar101 |
                      ((char)bVar103 >= (char)bVar101) * bVar103;
            bVar110 = ((char)bVar110 < (char)bVar105) * bVar105 |
                      ((char)bVar110 >= (char)bVar105) * bVar110;
            bVar116 = ((char)bVar116 < (char)bVar113) * bVar113 |
                      ((char)bVar116 >= (char)bVar113) * bVar116;
            bVar122 = ((char)bVar122 < (char)bVar119) * bVar119 |
                      ((char)bVar122 >= (char)bVar119) * bVar122;
            bVar128 = ((char)bVar128 < (char)bVar125) * bVar125 |
                      ((char)bVar128 >= (char)bVar125) * bVar128;
            bVar106 = ((char)bVar106 < (char)(byte)vF[0]) * (byte)vF[0] |
                      ((char)bVar106 >= (char)(byte)vF[0]) * bVar106;
            bVar111 = ((char)bVar111 < (char)vF[0]._1_1_) * vF[0]._1_1_ |
                      ((char)bVar111 >= (char)vF[0]._1_1_) * bVar111;
            bVar114 = ((char)bVar114 < (char)vF[0]._2_1_) * vF[0]._2_1_ |
                      ((char)bVar114 >= (char)vF[0]._2_1_) * bVar114;
            bVar117 = ((char)bVar117 < (char)vF[0]._3_1_) * vF[0]._3_1_ |
                      ((char)bVar117 >= (char)vF[0]._3_1_) * bVar117;
            bVar120 = ((char)bVar120 < (char)vF[0]._4_1_) * vF[0]._4_1_ |
                      ((char)bVar120 >= (char)vF[0]._4_1_) * bVar120;
            bVar123 = ((char)bVar123 < (char)vF[0]._5_1_) * vF[0]._5_1_ |
                      ((char)bVar123 >= (char)vF[0]._5_1_) * bVar123;
            bVar126 = ((char)bVar126 < (char)vF[0]._6_1_) * vF[0]._6_1_ |
                      ((char)bVar126 >= (char)vF[0]._6_1_) * bVar126;
            bVar129 = ((char)bVar129 < (char)vF[0]._7_1_) * vF[0]._7_1_ |
                      ((char)bVar129 >= (char)vF[0]._7_1_) * bVar129;
            vHM[1]._0_2_ = CONCAT11(bVar95,bVar91);
            vHM[1]._0_3_ = CONCAT12(bVar99,(undefined2)vHM[1]);
            vHM[1]._0_4_ = CONCAT13(bVar103,(undefined3)vHM[1]);
            vHM[1]._0_5_ = CONCAT14(bVar110,(undefined4)vHM[1]);
            vHM[1]._0_6_ = CONCAT15(bVar116,(undefined5)vHM[1]);
            vHM[1]._0_7_ = CONCAT16(bVar122,(undefined6)vHM[1]);
            vHM[1] = CONCAT17(bVar128,(undefined7)vHM[1]);
            vH[0]._0_2_ = CONCAT11(bVar111,bVar106);
            vH[0]._0_3_ = CONCAT12(bVar114,(undefined2)vH[0]);
            vH[0]._0_4_ = CONCAT13(bVar117,(undefined3)vH[0]);
            vH[0]._0_5_ = CONCAT14(bVar120,(undefined4)vH[0]);
            vH[0]._0_6_ = CONCAT15(bVar123,(undefined5)vH[0]);
            vH[0]._0_7_ = CONCAT16(bVar126,(undefined6)vH[0]);
            vH[0] = CONCAT17(bVar129,(undefined7)vH[0]);
            case2[1]._0_2_ = CONCAT11(-(bVar95 == bStack_877),-(bVar91 == local_878));
            case2[1]._0_3_ = CONCAT12(-(bVar99 == bStack_876),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(bVar103 == bStack_875),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(bVar110 == bStack_874),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(bVar116 == bStack_873),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(bVar122 == bStack_872),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(bVar128 == bStack_871),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(bVar111 == bStack_86f),-(bVar106 == bStack_870));
            case1[0]._0_3_ = CONCAT12(-(bVar114 == bStack_86e),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(bVar117 == bStack_86d),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(bVar120 == bStack_86c),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(bVar123 == bStack_86b),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(bVar126 == bStack_86a),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(bVar129 == bStack_869),(undefined7)case1[0]);
            cVar78 = -(bVar91 == bVar77);
            cVar92 = -(bVar95 == bVar93);
            cVar94 = -(bVar99 == bVar97);
            cVar96 = -(bVar103 == bVar101);
            cVar98 = -(bVar110 == bVar105);
            cVar100 = -(bVar116 == bVar113);
            cVar102 = -(bVar122 == bVar119);
            cVar104 = -(bVar128 == bVar125);
            cVar107 = -(bVar106 == (byte)vF[0]);
            cVar112 = -(bVar111 == vF[0]._1_1_);
            cVar115 = -(bVar114 == vF[0]._2_1_);
            cVar118 = -(bVar117 == vF[0]._3_1_);
            cVar121 = -(bVar120 == vF[0]._4_1_);
            cVar124 = -(bVar123 == vF[0]._5_1_);
            cVar127 = -(bVar126 == vF[0]._6_1_);
            cVar130 = -(bVar129 == vF[0]._7_1_);
            auVar37[1] = cVar92;
            auVar37[0] = cVar78;
            auVar37[2] = cVar94;
            auVar37[3] = cVar96;
            auVar37[4] = cVar98;
            auVar37[5] = cVar100;
            auVar37[6] = cVar102;
            auVar37[7] = cVar104;
            auVar37[9] = cVar112;
            auVar37[8] = cVar107;
            auVar37[10] = cVar115;
            auVar37[0xb] = cVar118;
            auVar37[0xc] = cVar121;
            auVar37[0xd] = cVar124;
            auVar37[0xe] = cVar127;
            auVar37[0xf] = cVar130;
            auVar86 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_03[k],auVar36);
            auVar35[1] = cVar92;
            auVar35[0] = cVar78;
            auVar35[2] = cVar94;
            auVar35[3] = cVar96;
            auVar35[4] = cVar98;
            auVar35[5] = cVar100;
            auVar35[6] = cVar102;
            auVar35[7] = cVar104;
            auVar35[9] = cVar112;
            auVar35[8] = cVar107;
            auVar35[10] = cVar115;
            auVar35[0xb] = cVar118;
            auVar35[0xc] = cVar121;
            auVar35[0xd] = cVar124;
            auVar35[0xe] = cVar127;
            auVar35[0xf] = cVar130;
            auVar86 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar35);
            auVar34._8_8_ = case1[0];
            auVar34._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_04[k],auVar34);
            auVar33[1] = cVar92;
            auVar33[0] = cVar78;
            auVar33[2] = cVar94;
            auVar33[3] = cVar96;
            auVar33[4] = cVar98;
            auVar33[5] = cVar100;
            auVar33[6] = cVar102;
            auVar33[7] = cVar104;
            auVar33[9] = cVar112;
            auVar33[8] = cVar107;
            auVar33[10] = cVar115;
            auVar33[0xb] = cVar118;
            auVar33[0xc] = cVar121;
            auVar33[0xd] = cVar124;
            auVar33[0xe] = cVar127;
            auVar33[0xf] = cVar130;
            auVar86 = pblendvb((undefined1  [16])b_02[k],register0x00001200,auVar33);
            auVar32._8_8_ = case1[0];
            auVar32._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_05[k],auVar32);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_148 = (char)vSaturationCheckMax[1];
            cStack_147 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_146 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_145 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_144 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_143 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_142 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_141 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_140 = (char)vSaturationCheckMin[0];
            cStack_13f = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_13e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_13d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_13c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_13b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_13a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_139 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            vSaturationCheckMax[1] =
                 CONCAT17(((char)bVar128 < cStack_141) * bVar128 |
                          ((char)bVar128 >= cStack_141) * cStack_141,
                          CONCAT16(((char)bVar122 < cStack_142) * bVar122 |
                                   ((char)bVar122 >= cStack_142) * cStack_142,
                                   CONCAT15(((char)bVar116 < cStack_143) * bVar116 |
                                            ((char)bVar116 >= cStack_143) * cStack_143,
                                            CONCAT14(((char)bVar110 < cStack_144) * bVar110 |
                                                     ((char)bVar110 >= cStack_144) * cStack_144,
                                                     CONCAT13(((char)bVar103 < cStack_145) * bVar103
                                                              | ((char)bVar103 >= cStack_145) *
                                                                cStack_145,
                                                              CONCAT12(((char)bVar99 < cStack_146) *
                                                                       bVar99 | ((char)bVar99 >=
                                                                                cStack_146) *
                                                                                cStack_146,
                                                                       CONCAT11(((char)bVar95 <
                                                                                cStack_147) * bVar95
                                                                                | ((char)bVar95 >=
                                                                                  cStack_147) *
                                                                                  cStack_147,
                                                                                ((char)bVar91 <
                                                                                local_148) * bVar91
                                                                                | ((char)bVar91 >=
                                                                                  local_148) *
                                                                                  local_148)))))));
            vSaturationCheckMin[0] =
                 CONCAT17(((char)bVar129 < cStack_139) * bVar129 |
                          ((char)bVar129 >= cStack_139) * cStack_139,
                          CONCAT16(((char)bVar126 < cStack_13a) * bVar126 |
                                   ((char)bVar126 >= cStack_13a) * cStack_13a,
                                   CONCAT15(((char)bVar123 < cStack_13b) * bVar123 |
                                            ((char)bVar123 >= cStack_13b) * cStack_13b,
                                            CONCAT14(((char)bVar120 < cStack_13c) * bVar120 |
                                                     ((char)bVar120 >= cStack_13c) * cStack_13c,
                                                     CONCAT13(((char)bVar117 < cStack_13d) * bVar117
                                                              | ((char)bVar117 >= cStack_13d) *
                                                                cStack_13d,
                                                              CONCAT12(((char)bVar114 < cStack_13e)
                                                                       * bVar114 |
                                                                       ((char)bVar114 >= cStack_13e)
                                                                       * cStack_13e,
                                                                       CONCAT11(((char)bVar111 <
                                                                                cStack_13f) *
                                                                                bVar111 | ((char)
                                                  bVar111 >= cStack_13f) * cStack_13f,
                                                  ((char)bVar106 < cStack_140) * bVar106 |
                                                  ((char)bVar106 >= cStack_140) * cStack_140)))))));
            local_8b8 = (char)vNegInfFront[1];
            cStack_8b7 = (char)((ulong)vNegInfFront[1] >> 8);
            cStack_8b6 = (char)((ulong)vNegInfFront[1] >> 0x10);
            cStack_8b5 = (char)((ulong)vNegInfFront[1] >> 0x18);
            cStack_8b4 = (char)((ulong)vNegInfFront[1] >> 0x20);
            cStack_8b3 = (char)((ulong)vNegInfFront[1] >> 0x28);
            cStack_8b2 = (char)((ulong)vNegInfFront[1] >> 0x30);
            cStack_8b1 = (char)((ulong)vNegInfFront[1] >> 0x38);
            cStack_8b0 = (char)vSaturationCheckMax[0];
            cStack_8af = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_8ae = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_8ad = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_8ac = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_8ab = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_8aa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_8a9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            bVar77 = (local_8b8 < (char)bVar91) * bVar91 | (local_8b8 >= (char)bVar91) * local_8b8;
            bVar91 = (cStack_8b7 < (char)bVar95) * bVar95 |
                     (cStack_8b7 >= (char)bVar95) * cStack_8b7;
            bVar93 = (cStack_8b6 < (char)bVar99) * bVar99 |
                     (cStack_8b6 >= (char)bVar99) * cStack_8b6;
            bVar95 = (cStack_8b5 < (char)bVar103) * bVar103 |
                     (cStack_8b5 >= (char)bVar103) * cStack_8b5;
            bVar97 = (cStack_8b4 < (char)bVar110) * bVar110 |
                     (cStack_8b4 >= (char)bVar110) * cStack_8b4;
            bVar99 = (cStack_8b3 < (char)bVar116) * bVar116 |
                     (cStack_8b3 >= (char)bVar116) * cStack_8b3;
            bVar101 = (cStack_8b2 < (char)bVar122) * bVar122 |
                      (cStack_8b2 >= (char)bVar122) * cStack_8b2;
            bVar103 = (cStack_8b1 < (char)bVar128) * bVar128 |
                      (cStack_8b1 >= (char)bVar128) * cStack_8b1;
            bVar105 = (cStack_8b0 < (char)bVar106) * bVar106 |
                      (cStack_8b0 >= (char)bVar106) * cStack_8b0;
            bVar110 = (cStack_8af < (char)bVar111) * bVar111 |
                      (cStack_8af >= (char)bVar111) * cStack_8af;
            bVar113 = (cStack_8ae < (char)bVar114) * bVar114 |
                      (cStack_8ae >= (char)bVar114) * cStack_8ae;
            bVar116 = (cStack_8ad < (char)bVar117) * bVar117 |
                      (cStack_8ad >= (char)bVar117) * cStack_8ad;
            bVar119 = (cStack_8ac < (char)bVar120) * bVar120 |
                      (cStack_8ac >= (char)bVar120) * cStack_8ac;
            bVar122 = (cStack_8ab < (char)bVar123) * bVar123 |
                      (cStack_8ab >= (char)bVar123) * cStack_8ab;
            bVar125 = (cStack_8aa < (char)bVar126) * bVar126 |
                      (cStack_8aa >= (char)bVar126) * cStack_8aa;
            bVar128 = (cStack_8a9 < (char)bVar129) * bVar129 |
                      (cStack_8a9 >= (char)bVar129) * cStack_8a9;
            local_8e8 = (char)vHS[1];
            cStack_8e7 = vHS[1]._1_1_;
            cStack_8e6 = vHS[1]._2_1_;
            cStack_8e5 = vHS[1]._3_1_;
            cStack_8e4 = vHS[1]._4_1_;
            cStack_8e3 = vHS[1]._5_1_;
            cStack_8e2 = vHS[1]._6_1_;
            cStack_8e1 = vHS[1]._7_1_;
            cStack_8e0 = (char)vHS[2];
            cStack_8df = vHS[2]._1_1_;
            cStack_8de = vHS[2]._2_1_;
            cStack_8dd = vHS[2]._3_1_;
            cStack_8dc = vHS[2]._4_1_;
            cStack_8db = vHS[2]._5_1_;
            cStack_8da = vHS[2]._6_1_;
            cStack_8d9 = vHS[2]._7_1_;
            bVar77 = ((char)bVar77 < local_8e8) * local_8e8 | ((char)bVar77 >= local_8e8) * bVar77;
            bVar91 = ((char)bVar91 < cStack_8e7) * cStack_8e7 |
                     ((char)bVar91 >= cStack_8e7) * bVar91;
            bVar93 = ((char)bVar93 < cStack_8e6) * cStack_8e6 |
                     ((char)bVar93 >= cStack_8e6) * bVar93;
            bVar95 = ((char)bVar95 < cStack_8e5) * cStack_8e5 |
                     ((char)bVar95 >= cStack_8e5) * bVar95;
            bVar97 = ((char)bVar97 < cStack_8e4) * cStack_8e4 |
                     ((char)bVar97 >= cStack_8e4) * bVar97;
            bVar99 = ((char)bVar99 < cStack_8e3) * cStack_8e3 |
                     ((char)bVar99 >= cStack_8e3) * bVar99;
            bVar101 = ((char)bVar101 < cStack_8e2) * cStack_8e2 |
                      ((char)bVar101 >= cStack_8e2) * bVar101;
            bVar103 = ((char)bVar103 < cStack_8e1) * cStack_8e1 |
                      ((char)bVar103 >= cStack_8e1) * bVar103;
            bVar105 = ((char)bVar105 < cStack_8e0) * cStack_8e0 |
                      ((char)bVar105 >= cStack_8e0) * bVar105;
            bVar110 = ((char)bVar110 < cStack_8df) * cStack_8df |
                      ((char)bVar110 >= cStack_8df) * bVar110;
            bVar113 = ((char)bVar113 < cStack_8de) * cStack_8de |
                      ((char)bVar113 >= cStack_8de) * bVar113;
            bVar116 = ((char)bVar116 < cStack_8dd) * cStack_8dd |
                      ((char)bVar116 >= cStack_8dd) * bVar116;
            bVar119 = ((char)bVar119 < cStack_8dc) * cStack_8dc |
                      ((char)bVar119 >= cStack_8dc) * bVar119;
            bVar122 = ((char)bVar122 < cStack_8db) * cStack_8db |
                      ((char)bVar122 >= cStack_8db) * bVar122;
            bVar125 = ((char)bVar125 < cStack_8da) * cStack_8da |
                      ((char)bVar125 >= cStack_8da) * bVar125;
            bVar128 = ((char)bVar128 < cStack_8d9) * cStack_8d9 |
                      ((char)bVar128 >= cStack_8d9) * bVar128;
            local_908 = (char)vHL[1];
            cStack_907 = vHL[1]._1_1_;
            cStack_906 = vHL[1]._2_1_;
            cStack_905 = vHL[1]._3_1_;
            cStack_904 = vHL[1]._4_1_;
            cStack_903 = vHL[1]._5_1_;
            cStack_902 = vHL[1]._6_1_;
            cStack_901 = vHL[1]._7_1_;
            cStack_900 = (char)vHL[2];
            cStack_8ff = vHL[2]._1_1_;
            cStack_8fe = vHL[2]._2_1_;
            cStack_8fd = vHL[2]._3_1_;
            cStack_8fc = vHL[2]._4_1_;
            cStack_8fb = vHL[2]._5_1_;
            cStack_8fa = vHL[2]._6_1_;
            cStack_8f9 = vHL[2]._7_1_;
            bVar77 = ((char)bVar77 < local_908) * local_908 | ((char)bVar77 >= local_908) * bVar77;
            bVar91 = ((char)bVar91 < cStack_907) * cStack_907 |
                     ((char)bVar91 >= cStack_907) * bVar91;
            bVar93 = ((char)bVar93 < cStack_906) * cStack_906 |
                     ((char)bVar93 >= cStack_906) * bVar93;
            bVar95 = ((char)bVar95 < cStack_905) * cStack_905 |
                     ((char)bVar95 >= cStack_905) * bVar95;
            bVar97 = ((char)bVar97 < cStack_904) * cStack_904 |
                     ((char)bVar97 >= cStack_904) * bVar97;
            bVar99 = ((char)bVar99 < cStack_903) * cStack_903 |
                     ((char)bVar99 >= cStack_903) * bVar99;
            bVar101 = ((char)bVar101 < cStack_902) * cStack_902 |
                      ((char)bVar101 >= cStack_902) * bVar101;
            bVar103 = ((char)bVar103 < cStack_901) * cStack_901 |
                      ((char)bVar103 >= cStack_901) * bVar103;
            bVar105 = ((char)bVar105 < cStack_900) * cStack_900 |
                      ((char)bVar105 >= cStack_900) * bVar105;
            bVar110 = ((char)bVar110 < cStack_8ff) * cStack_8ff |
                      ((char)bVar110 >= cStack_8ff) * bVar110;
            bVar113 = ((char)bVar113 < cStack_8fe) * cStack_8fe |
                      ((char)bVar113 >= cStack_8fe) * bVar113;
            bVar116 = ((char)bVar116 < cStack_8fd) * cStack_8fd |
                      ((char)bVar116 >= cStack_8fd) * bVar116;
            bVar119 = ((char)bVar119 < cStack_8fc) * cStack_8fc |
                      ((char)bVar119 >= cStack_8fc) * bVar119;
            bVar122 = ((char)bVar122 < cStack_8fb) * cStack_8fb |
                      ((char)bVar122 >= cStack_8fb) * bVar122;
            bVar125 = ((char)bVar125 < cStack_8fa) * cStack_8fa |
                      ((char)bVar125 >= cStack_8fa) * bVar125;
            bVar128 = ((char)bVar128 < cStack_8f9) * cStack_8f9 |
                      ((char)bVar128 >= cStack_8f9) * bVar128;
            local_928 = (char)vHp[1];
            cStack_927 = vHp[1]._1_1_;
            cStack_926 = vHp[1]._2_1_;
            cStack_925 = vHp[1]._3_1_;
            cStack_924 = vHp[1]._4_1_;
            cStack_923 = vHp[1]._5_1_;
            cStack_922 = vHp[1]._6_1_;
            cStack_921 = vHp[1]._7_1_;
            cStack_920 = (char)vHp[2];
            cStack_91f = vHp[2]._1_1_;
            cStack_91e = vHp[2]._2_1_;
            cStack_91d = vHp[2]._3_1_;
            cStack_91c = vHp[2]._4_1_;
            cStack_91b = vHp[2]._5_1_;
            cStack_91a = vHp[2]._6_1_;
            cStack_919 = vHp[2]._7_1_;
            vNegInfFront[1] =
                 CONCAT17(((char)bVar103 < cStack_921) * cStack_921 |
                          ((char)bVar103 >= cStack_921) * bVar103,
                          CONCAT16(((char)bVar101 < cStack_922) * cStack_922 |
                                   ((char)bVar101 >= cStack_922) * bVar101,
                                   CONCAT15(((char)bVar99 < cStack_923) * cStack_923 |
                                            ((char)bVar99 >= cStack_923) * bVar99,
                                            CONCAT14(((char)bVar97 < cStack_924) * cStack_924 |
                                                     ((char)bVar97 >= cStack_924) * bVar97,
                                                     CONCAT13(((char)bVar95 < cStack_925) *
                                                              cStack_925 |
                                                              ((char)bVar95 >= cStack_925) * bVar95,
                                                              CONCAT12(((char)bVar93 < cStack_926) *
                                                                       cStack_926 |
                                                                       ((char)bVar93 >= cStack_926)
                                                                       * bVar93,CONCAT11(((char)
                                                  bVar91 < cStack_927) * cStack_927 |
                                                  ((char)bVar91 >= cStack_927) * bVar91,
                                                  ((char)bVar77 < local_928) * local_928 |
                                                  ((char)bVar77 >= local_928) * bVar77)))))));
            vSaturationCheckMax[0] =
                 CONCAT17(((char)bVar128 < cStack_919) * cStack_919 |
                          ((char)bVar128 >= cStack_919) * bVar128,
                          CONCAT16(((char)bVar125 < cStack_91a) * cStack_91a |
                                   ((char)bVar125 >= cStack_91a) * bVar125,
                                   CONCAT15(((char)bVar122 < cStack_91b) * cStack_91b |
                                            ((char)bVar122 >= cStack_91b) * bVar122,
                                            CONCAT14(((char)bVar119 < cStack_91c) * cStack_91c |
                                                     ((char)bVar119 >= cStack_91c) * bVar119,
                                                     CONCAT13(((char)bVar116 < cStack_91d) *
                                                              cStack_91d |
                                                              ((char)bVar116 >= cStack_91d) *
                                                              bVar116,CONCAT12(((char)bVar113 <
                                                                               cStack_91e) *
                                                                               cStack_91e |
                                                                               ((char)bVar113 >=
                                                                               cStack_91e) * bVar113
                                                                               ,CONCAT11(((char)
                                                  bVar110 < cStack_91f) * cStack_91f |
                                                  ((char)bVar110 >= cStack_91f) * bVar110,
                                                  ((char)bVar105 < cStack_920) * cStack_920 |
                                                  ((char)bVar105 >= cStack_920) * bVar105)))))));
          }
        }
        vH_1[0] = ptr[iVar76][1];
        vHM_1[0] = b_03[iVar76][1];
        vHS_1[0] = b_04[iVar76][1];
        vHL_1[0] = b_05[iVar76][1];
        uStack_1488 = b_05[iVar76][0];
        vHL_1[1] = b_04[iVar76][0];
        vHS_1[1] = b_03[iVar76][0];
        vHM_1[1] = ptr[iVar76][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar73) + 0x10U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 8 | (ulong)vHM_1[1] >> 0x38;
          vHM_1[0] = vHM_1[0] << 8 | (ulong)vHS_1[1] >> 0x38;
          vHS_1[0] = vHS_1[0] << 8 | (ulong)vHL_1[1] >> 0x38;
          vHL_1[0] = vHL_1[0] << 8 | uStack_1488 >> 0x38;
          uStack_1488 = uStack_1488 << 8;
          vHL_1[1] = vHL_1[1] << 8;
          vHS_1[1] = vHS_1[1] << 8;
          vHM_1[1] = vHM_1[1] << 8;
        }
        local_1109 = vH_1[0]._7_1_;
        local_110a = vHM_1[0]._7_1_;
        local_110b = vHS_1[0]._7_1_;
        local_110c = vHL_1[0]._7_1_;
        local_108 = (char)vSaturationCheckMax[1];
        cStack_107 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_106 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_105 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_104 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_103 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_102 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_101 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_100 = (char)vSaturationCheckMin[0];
        cStack_ff = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_fe = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_fd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_fc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_fb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_fa = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_f9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_a18 = (char)vNegInfFront[1];
        cStack_a17 = (char)((ulong)vNegInfFront[1] >> 8);
        cStack_a16 = (char)((ulong)vNegInfFront[1] >> 0x10);
        cStack_a15 = (char)((ulong)vNegInfFront[1] >> 0x18);
        cStack_a14 = (char)((ulong)vNegInfFront[1] >> 0x20);
        cStack_a13 = (char)((ulong)vNegInfFront[1] >> 0x28);
        cStack_a12 = (char)((ulong)vNegInfFront[1] >> 0x30);
        cStack_a11 = (char)((ulong)vNegInfFront[1] >> 0x38);
        cStack_a10 = (char)vSaturationCheckMax[0];
        cStack_a0f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_a0e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_a0d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_a0c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_a0b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_a0a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_a09 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar109 = CONCAT17(-(cStack_f9 < (char)bVar71),
                           CONCAT16(-(cStack_fa < (char)bVar71),
                                    CONCAT15(-(cStack_fb < (char)bVar71),
                                             CONCAT14(-(cStack_fc < (char)bVar71),
                                                      CONCAT13(-(cStack_fd < (char)bVar71),
                                                               CONCAT12(-(cStack_fe < (char)bVar71),
                                                                        CONCAT11(-(cStack_ff <
                                                                                  (char)bVar71),
                                                                                 -(cStack_100 <
                                                                                  (char)bVar71))))))
                                   )) |
                  CONCAT17(-(cVar72 < cStack_a09),
                           CONCAT16(-(cVar72 < cStack_a0a),
                                    CONCAT15(-(cVar72 < cStack_a0b),
                                             CONCAT14(-(cVar72 < cStack_a0c),
                                                      CONCAT13(-(cVar72 < cStack_a0d),
                                                               CONCAT12(-(cVar72 < cStack_a0e),
                                                                        CONCAT11(-(cVar72 < 
                                                  cStack_a0f),-(cVar72 < cStack_a10))))))));
        auVar69._8_8_ = uVar109;
        auVar69._0_8_ =
             CONCAT17(-(cStack_101 < (char)bVar71),
                      CONCAT16(-(cStack_102 < (char)bVar71),
                               CONCAT15(-(cStack_103 < (char)bVar71),
                                        CONCAT14(-(cStack_104 < (char)bVar71),
                                                 CONCAT13(-(cStack_105 < (char)bVar71),
                                                          CONCAT12(-(cStack_106 < (char)bVar71),
                                                                   CONCAT11(-(cStack_107 <
                                                                             (char)bVar71),
                                                                            -(local_108 <
                                                                             (char)bVar71)))))))) |
             CONCAT17(-(cVar72 < cStack_a11),
                      CONCAT16(-(cVar72 < cStack_a12),
                               CONCAT15(-(cVar72 < cStack_a13),
                                        CONCAT14(-(cVar72 < cStack_a14),
                                                 CONCAT13(-(cVar72 < cStack_a15),
                                                          CONCAT12(-(cVar72 < cStack_a16),
                                                                   CONCAT11(-(cVar72 < cStack_a17),
                                                                            -(cVar72 < local_a18))))
                                                ))));
        if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar109 >> 7 & 1) != 0) || (uVar109 >> 0xf & 1) != 0) ||
                (uVar109 >> 0x17 & 1) != 0) || (uVar109 >> 0x1f & 1) != 0) ||
              (uVar109 >> 0x27 & 1) != 0) || (uVar109 >> 0x2f & 1) != 0) ||
            (uVar109 >> 0x37 & 1) != 0) || (long)uVar109 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_1109 = '\0';
          local_110a = '\0';
          local_110b = '\0';
          local_110c = '\0';
          local_1008 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)local_1109;
        *(int *)((long)&profile_local->s1 + 4) = local_1008;
        profile_local->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_110a;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_110b;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_110c;
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile8.score;
    pvPm = (__m128i*)profile->profile8.matches;
    pvPs = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi8(segLen), 1);
    vNegInfFront = _mm_insert_epi8(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            vGapperL = _mm_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHpM = _mm_slli_si128(vHpM, 1);
        vHpS = _mm_slli_si128(vHpS, 1);
        vHpL = _mm_slli_si128(vHpL, 1);
        vHp = _mm_insert_epi8(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi8(vH, vGapO);
            vE_ext = _mm_subs_epi8(vE, vGapE);
            case1 = _mm_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm_max_epi8(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi8(vEL, vOne);
            vGapper = _mm_adds_epi8(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vF, vGapper),
                    _mm_cmpeq_epi8(vF, vGapper));
            vF = _mm_max_epi8(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi8(vHp, vW);
            vHpM = _mm_adds_epi8(vHpM, vWM);
            vHpS = _mm_adds_epi8(vHpS, vWS);
            vHpL = _mm_adds_epi8(vHpL, vOne);
            case1 = _mm_cmpgt_epi8(vE, vHp);
            vHt = _mm_max_epi8(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHtM = _mm_slli_si128(vHtM, 1);
        vHtS = _mm_slli_si128(vHtS, 1);
        vHtL = _mm_slli_si128(vHtL, 1);
        vHt = _mm_insert_epi8(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi8(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi8(vGapper, vF),
                _mm_cmpeq_epi8(vGapper, vF));
        vF = _mm_max_epi8(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            __m128i vFtM = _mm_slli_si128(vFM, 1);
            __m128i vFtS = _mm_slli_si128(vFS, 1);
            __m128i vFtL = _mm_slli_si128(vFL, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vFt, vF),
                    _mm_cmpeq_epi8(vFt, vF));
            vF = _mm_max_epi8(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vFM = _mm_slli_si128(vFM, 1);
        vFS = _mm_slli_si128(vFS, 1);
        vFL = _mm_slli_si128(vFL, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi8(vF, vHt);
        vH = _mm_max_epi8(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi8(vH, vGapO);
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi8(vFL, vOne);
            vH = _mm_max_epi8(vHp, vE);
            vH = _mm_max_epi8(vH, vF);
            case1 = _mm_cmpeq_epi8(vH, vHp);
            case2 = _mm_cmpeq_epi8(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
                vHM = _mm_slli_si128(vHM, 1);
                vHS = _mm_slli_si128(vHS, 1);
                vHL = _mm_slli_si128(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
            result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}